

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void ipred_dc(pel *src,pel *dst,int i_dst,int w,int h,u16 avail_cu,int bit_depth)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar7;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)h;
  if ((avail_cu & 2) == 0) {
    if ((avail_cu & 1) == 0) {
      uVar7 = 1 << ((char)bit_depth - 1U & 0x1f);
      goto LAB_00119544;
    }
    if (w < 1) {
      iVar2 = 0;
    }
    else {
      uVar4 = 0;
      iVar2 = 0;
      do {
        lVar3 = uVar4 + 1;
        uVar4 = uVar4 + 1;
        iVar2 = iVar2 + (uint)src[lVar3];
      } while ((uint)w != uVar4);
    }
    iVar2 = (w >> 1) + iVar2;
    iVar1 = w;
  }
  else {
    if (h < 1) {
      iVar2 = 0;
    }
    else {
      lVar3 = 0;
      iVar2 = 0;
      do {
        iVar2 = iVar2 + (uint)src[lVar3 + -1];
        lVar3 = lVar3 + -1;
      } while (-lVar3 != uVar6);
    }
    if ((avail_cu & 1) != 0) {
      if (0 < w) {
        uVar4 = 0;
        do {
          lVar3 = uVar4 + 1;
          uVar4 = uVar4 + 1;
          iVar2 = iVar2 + (uint)src[lVar3];
        } while ((uint)w != uVar4);
      }
      uVar7 = (int)(0x1000 / (long)(h + w)) * ((h + w >> 1) + iVar2) >> 0xc;
      goto LAB_00119544;
    }
    iVar2 = iVar2 + (h >> 1);
    iVar1 = h;
  }
  uVar7 = iVar2 >> (g_tbl_log2[iVar1] & 0x1fU);
LAB_00119544:
  if (h != 0) {
    do {
      memset(dst,uVar7 & 0xff,(long)w);
      dst = dst + i_dst;
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void ipred_dc(pel *src, pel *dst, int i_dst, int w, int h, u16 avail_cu, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    int dc = 0;
    int i, j;
    if(IS_AVAIL(avail_cu, AVAIL_LE)) {
        for (i = 0; i < h; i++) {
            dc += src[-i-1];
        }
        if(IS_AVAIL(avail_cu, AVAIL_UP)) {
            for (j = 0; j < w; j++) {
                dc += src[j+1];
            }
            dc = (dc + ((w + h) >> 1)) * (4096 / (w + h)) >> 12;
        } else {
            dc = (dc + (h >> 1)) >> g_tbl_log2[h];
        }
    } else if(IS_AVAIL(avail_cu, AVAIL_UP)) {
        for (j = 0; j < w; j++) {
            dc += src[j+1];
        }
        dc = (dc + (w >> 1)) >> g_tbl_log2[w];
    } else {     
        dc = 1 << (bit_depth - 1);
    }

    while(h--) {
        com_mset_pel(dst, dc, w);
        dst += i_dst;
    }
}